

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

int PAL_iswalpha(char16_t c)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = PAL_iswupper(c);
    if ((iVar1 == 0) && (iVar1 = PAL_iswlower(c), iVar1 == 0)) {
      if (PAL_InitializeChakraCoreCalled != false) {
        return 0;
      }
    }
    else if (PAL_InitializeChakraCoreCalled != false) {
      return 1;
    }
  }
  abort();
}

Assistant:

int
__cdecl
PAL_iswalpha( char16_t c )
{
    PERF_ENTRY(iswalpha);
    ENTRY( "PAL_iswalpha (c=%d)\n", c);

    if ( PAL_iswupper( c ) || PAL_iswlower( c ) )
    {
        LOGEXIT( "PAL_iswalpha returns 1.\n" );
        PERF_EXIT(iswalpha);
        return 1;
    }

    LOGEXIT( "PAL_iswalpha returns 0.\n" );
    PERF_EXIT(iswalpha);
    return 0;
}